

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track.c
# Opt level: O1

void restore_track(memfile *mf)

{
  int8_t iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    iVar1 = mread8(mf);
    utrack[lVar2].x = iVar1;
    iVar1 = mread8(mf);
    utrack[lVar2].y = iVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x32);
  utcnt = mread32(mf);
  utpnt = mread32(mf);
  return;
}

Assistant:

void restore_track(struct memfile *mf)
{
    int i;
    for (i = 0; i < UTSZ; i++) {
	utrack[i].x = mread8(mf);
	utrack[i].y = mread8(mf);
    }
    utcnt = mread32(mf);
    utpnt = mread32(mf);
}